

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helpers.hpp
# Opt level: O0

string * toString_abi_cxx11_(string *__return_storage_ptr__,char input)

{
  allocator<char> local_12;
  char local_11;
  string *psStack_10;
  char input_local;
  
  local_11 = input;
  psStack_10 = __return_storage_ptr__;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,1,input,&local_12);
  std::allocator<char>::~allocator(&local_12);
  return __return_storage_ptr__;
}

Assistant:

string toString(char input) {
	return string(1, input);
}